

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall Map::Continent::Continent(Continent *this,Continent *toCopy)

{
  string *this_00;
  int *piVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_01;
  Continent *toCopy_local;
  Continent *this_local;
  
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00);
  this->pCName = this_00;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  this->pCTroops = piVar1;
  this_01 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector(this_01);
  this->pCountriesInContinent = this_01;
  std::__cxx11::string::operator=((string *)this->pCName,(string *)toCopy->pCName);
  *this->pCTroops = *toCopy->pCTroops;
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::operator=
            (this->pCountriesInContinent,toCopy->pCountriesInContinent);
  return;
}

Assistant:

Map::Continent::Continent(Map::Continent &toCopy) {
    pCName = new string();
    pCTroops = new int();
    pCountriesInContinent = new vector<Country*>;
    *pCName = *toCopy.pCName;
    *pCTroops = *toCopy.pCTroops;
    *pCountriesInContinent = *toCopy.pCountriesInContinent;
}